

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
vkt::shaderexecutor::Functions::Mul::doApply
          (Interval *__return_storage_ptr__,Mul *this,EvalContext *ctx,IArgs *iargs)

{
  Interval *pIVar1;
  double dVar2;
  double dVar3;
  Interval **ppIVar4;
  double *pdVar5;
  undefined8 *puVar6;
  bool bVar7;
  deBool dVar8;
  Interval local_208;
  Interval local_1f0;
  Interval *local_1d8;
  Interval *pIStack_1d0;
  Interval *local_1c8;
  Interval **local_1c0;
  Interval *prod_3;
  double dStack_1b0;
  double local_1a8;
  double *local_1a0;
  Interval *prod_2;
  Interval prod_hi__1;
  Interval prod_lo__1;
  Interval *prod_dst__1;
  undefined1 local_158 [4];
  ScopedRoundingMode prod_ctx__1;
  Interval local_140;
  Interval *local_128;
  Interval *pIStack_120;
  Interval *local_118;
  Interval **local_110;
  Interval *prod_1;
  double dStack_100;
  double local_f8;
  undefined8 *local_f0;
  Interval *prod;
  Interval prod_hi_;
  undefined1 auStack_c0 [8];
  Interval prod_lo_;
  Interval *prod_dst_;
  double dStack_98;
  ScopedRoundingMode prod_ctx_;
  double local_90;
  double local_88;
  double local_80 [3];
  undefined1 local_68 [8];
  Interval ret;
  Interval b;
  Interval a;
  IArgs *iargs_local;
  EvalContext *ctx_local;
  Mul *this_local;
  
  b.m_hi = *(double *)iargs->a;
  pIVar1 = iargs->b;
  ret.m_hi = *(double *)pIVar1;
  b._0_8_ = pIVar1->m_lo;
  b.m_lo = pIVar1->m_hi;
  bVar7 = tcu::Interval::isOrdinary((Interval *)&b.m_hi);
  if ((bVar7) && (bVar7 = tcu::Interval::isOrdinary((Interval *)&ret.m_hi), bVar7)) {
    tcu::Interval::Interval((Interval *)local_68);
    dVar2 = tcu::Interval::hi((Interval *)&b.m_hi);
    if (dVar2 < 0.0) {
      tcu::Interval::operator-((Interval *)local_80,(Interval *)&b.m_hi);
      b.m_hi = local_80[0];
      tcu::Interval::operator-((Interval *)&stack0xffffffffffffff68,(Interval *)&ret.m_hi);
      ret.m_hi = dStack_98;
      b._0_8_ = local_90;
      b.m_lo = local_88;
    }
    dVar2 = tcu::Interval::lo((Interval *)&b.m_hi);
    if ((0.0 <= dVar2) && (dVar2 = tcu::Interval::lo((Interval *)&ret.m_hi), 0.0 <= dVar2)) {
      do {
        tcu::ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&prod_dst_ + 4));
        prod_lo_.m_hi = (double)local_68;
        tcu::Interval::Interval((Interval *)auStack_c0);
        tcu::Interval::Interval((Interval *)&prod);
        local_f0 = (undefined8 *)auStack_c0;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar2 = tcu::Interval::lo(iargs->a);
        dVar3 = tcu::Interval::lo(iargs->b);
        tcu::Interval::Interval((Interval *)&prod_1,dVar2 * dVar3);
        puVar6 = local_f0;
        local_f0[2] = local_f8;
        dVar2 = dStack_100;
        *puVar6 = prod_1;
        puVar6[1] = dVar2;
        local_110 = &prod;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        dVar2 = tcu::Interval::hi(iargs->a);
        dVar3 = tcu::Interval::hi(iargs->b);
        tcu::Interval::Interval((Interval *)&local_128,dVar2 * dVar3);
        ppIVar4 = local_110;
        local_110[2] = local_118;
        pIVar1 = pIStack_120;
        *ppIVar4 = local_128;
        ppIVar4[1] = pIVar1;
        tcu::Interval::operator|(&local_140,(Interval *)auStack_c0,(Interval *)&prod);
        dVar2 = prod_lo_.m_hi;
        *(undefined8 *)prod_lo_.m_hi = local_140._0_8_;
        *(double *)((long)dVar2 + 8) = local_140.m_lo;
        *(double *)((long)dVar2 + 0x10) = local_140.m_hi;
        tcu::ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&prod_dst_ + 4));
        dVar8 = ::deGetFalse();
      } while (dVar8 != 0);
      tcu::FloatFormat::roundOut((Interval *)local_158,&ctx->format,(Interval *)local_68,true);
      tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,(Interval *)local_158);
      return __return_storage_ptr__;
    }
    dVar2 = tcu::Interval::lo((Interval *)&b.m_hi);
    if ((0.0 <= dVar2) && (dVar2 = tcu::Interval::hi((Interval *)&ret.m_hi), dVar2 <= 0.0)) {
      do {
        tcu::ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&prod_dst__1 + 4));
        tcu::Interval::Interval((Interval *)&prod_hi__1.m_hi);
        tcu::Interval::Interval((Interval *)&prod_2);
        local_1a0 = &prod_hi__1.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar2 = tcu::Interval::hi(iargs->a);
        dVar3 = tcu::Interval::lo(iargs->b);
        tcu::Interval::Interval((Interval *)&prod_3,dVar2 * dVar3);
        pdVar5 = local_1a0;
        local_1a0[2] = local_1a8;
        dVar2 = dStack_1b0;
        *pdVar5 = (double)prod_3;
        pdVar5[1] = dVar2;
        local_1c0 = &prod_2;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        dVar2 = tcu::Interval::lo(iargs->a);
        dVar3 = tcu::Interval::hi(iargs->b);
        tcu::Interval::Interval((Interval *)&local_1d8,dVar2 * dVar3);
        ppIVar4 = local_1c0;
        local_1c0[2] = local_1c8;
        pIVar1 = pIStack_1d0;
        *ppIVar4 = local_1d8;
        ppIVar4[1] = pIVar1;
        tcu::Interval::operator|(&local_1f0,(Interval *)&prod_hi__1.m_hi,(Interval *)&prod_2);
        local_68 = (undefined1  [8])local_1f0._0_8_;
        ret._0_8_ = local_1f0.m_lo;
        ret.m_lo = local_1f0.m_hi;
        tcu::ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&prod_dst__1 + 4))
        ;
        dVar8 = ::deGetFalse();
      } while (dVar8 != 0);
      tcu::FloatFormat::roundOut(&local_208,&ctx->format,(Interval *)local_68,true);
      tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_208);
      return __return_storage_ptr__;
    }
  }
  FloatFunc2::applyMonotone(__return_storage_ptr__,(FloatFunc2 *)this,ctx,iargs->a,iargs->b);
  return __return_storage_ptr__;
}

Assistant:

Interval	doApply		(const EvalContext&	ctx, const IArgs& iargs) const
	{
		Interval a = iargs.a;
		Interval b = iargs.b;

		// Fast-path for common case
		if (a.isOrdinary() && b.isOrdinary())
		{
			Interval ret;
			if (a.hi() < 0)
			{
				a = -a;
				b = -b;
			}
			if (a.lo() >= 0 && b.lo() >= 0)
			{
				TCU_SET_INTERVAL_BOUNDS(ret, prod,
										prod = iargs.a.lo() * iargs.b.lo(),
										prod = iargs.a.hi() * iargs.b.hi());
				return ctx.format.convert(ctx.format.roundOut(ret, true));
			}
			if (a.lo() >= 0 && b.hi() <= 0)
			{
				TCU_SET_INTERVAL_BOUNDS(ret, prod,
										prod = iargs.a.hi() * iargs.b.lo(),
										prod = iargs.a.lo() * iargs.b.hi());
				return ctx.format.convert(ctx.format.roundOut(ret, true));
			}
		}
		return this->applyMonotone(ctx, iargs.a, iargs.b);
	}